

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SharedArray.h
# Opt level: O2

void __thiscall
FIX::shared_array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
::release(shared_array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          *this)

{
  int iVar1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar2;
  long lVar3;
  atomic_count *counter;
  long lVar4;
  
  pbVar2 = this->m_buffer;
  if (pbVar2 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    LOCK();
    iVar1 = *(int *)&(pbVar2->_M_dataplus)._M_p;
    *(int *)&(pbVar2->_M_dataplus)._M_p = *(int *)&(pbVar2->_M_dataplus)._M_p + -1;
    UNLOCK();
    if (iVar1 == 1) {
      pbVar2 = this->m_buffer;
      this->m_size = 0;
      this->m_buffer = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
      if (pbVar2 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        lVar3 = *(long *)((long)&pbVar2[-1].field_2 + 8);
        if (lVar3 != 0) {
          lVar4 = lVar3 << 5;
          do {
            std::__cxx11::string::~string((string *)((long)&pbVar2[-1]._M_dataplus._M_p + lVar4));
            lVar4 = lVar4 + -0x20;
          } while (lVar4 != 0);
        }
        operator_delete__((void *)((long)&pbVar2[-1].field_2 + 8),lVar3 << 5 | 8);
        return;
      }
    }
  }
  return;
}

Assistant:

bool empty() const
    { return m_buffer == 0; }